

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LDAWBIC.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  pointer puVar2;
  size_type sVar3;
  ostream *poVar4;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *frequencyMatrix;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *docVoca;
  double dVar5;
  allocator local_321;
  uint n;
  undefined1 local_300 [8];
  vector<double,_std::allocator<double>_> beta;
  string local_2e0 [32];
  undefined1 local_2c0 [8];
  vector<double,_std::allocator<double>_> alpha;
  allocator local_291;
  string local_290 [32];
  undefined1 local_270 [8];
  BOWFileParser parser;
  char **argv_local;
  int argc_local;
  
  pcVar1 = argv[1];
  parser._docVoca.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)argv;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_290,pcVar1,&local_291);
  BOWFileParser::BOWFileParser((BOWFileParser *)local_270,(string *)local_290);
  std::__cxx11::string::~string(local_290);
  std::allocator<char>::~allocator((allocator<char> *)&local_291);
  puVar2 = ((parser._docVoca.
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage)->
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_2e0,(char *)puVar2,
             (allocator *)
             ((long)&beta.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  readHyperParam((vector<double,_std::allocator<double>_> *)local_2c0,(string *)local_2e0);
  std::__cxx11::string::~string(local_2e0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&beta.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  puVar2 = parser._docVoca.
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage[1].
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&n,(char *)puVar2,&local_321);
  readHyperParam((vector<double,_std::allocator<double>_> *)local_300,(string *)&n);
  std::__cxx11::string::~string((string *)&n);
  std::allocator<char>::~allocator((allocator<char> *)&local_321);
  if (argc == 5) {
    atoi((char *)parser._docVoca.
                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage[1].
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish);
  }
  sVar3 = std::vector<double,_std::allocator<double>_>::size
                    ((vector<double,_std::allocator<double>_> *)local_2c0);
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,sVar3);
  poVar4 = std::operator<<(poVar4,',');
  frequencyMatrix = BOWFileParser::getFrequencyMatrix((BOWFileParser *)local_270);
  docVoca = BOWFileParser::getDocVoca((BOWFileParser *)local_270);
  dVar5 = runWBICMetropolis(frequencyMatrix,docVoca,
                            (vector<double,_std::allocator<double>_> *)local_2c0,
                            (vector<double,_std::allocator<double>_> *)local_300,0);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,dVar5);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_300);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_2c0);
  BOWFileParser::~BOWFileParser((BOWFileParser *)local_270);
  return 0;
}

Assistant:

int main(int argc, char *argv[]){
    BOWFileParser parser(argv[1]);
    vector<double> alpha = readHyperParam(argv[2]);
    vector<double> beta = readHyperParam(argv[3]);
    unsigned int n;
    if(argc == 5){
        n = atoi(argv[4]);
    }
    cout<<alpha.size()<<','<<runWBICMetropolis(parser.getFrequencyMatrix(), parser.getDocVoca(), alpha, beta)<<endl;
    return 0;
}